

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O2

string * __thiscall
t_rs_generator::rust_upper_case(string *__return_storage_ptr__,t_rs_generator *this,string *name)

{
  pointer pcVar1;
  size_type sVar2;
  string *psVar3;
  int iVar4;
  size_type sVar5;
  int iVar6;
  t_rs_generator *this_00;
  string *__range1;
  allocator local_ba;
  allocator local_b9;
  string *local_b8;
  undefined1 local_b0 [32];
  string local_90;
  string local_70;
  string local_50;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  sVar2 = name->_M_string_length;
  sVar5 = 0;
  local_b8 = __return_storage_ptr__;
  while( true ) {
    psVar3 = local_b8;
    if (sVar2 == sVar5) {
      std::__cxx11::string::string((string *)local_b8,(string *)name);
      return psVar3;
    }
    iVar6 = (int)pcVar1[sVar5];
    iVar4 = isalpha(iVar6);
    if ((iVar4 != 0) && (iVar4 = islower(iVar6), iVar4 != 0)) break;
    sVar5 = sVar5 + 1;
  }
  std::__cxx11::string::string((string *)&local_50,(string *)name);
  t_generator::underscore(&local_70,&this->super_t_generator,&local_50);
  psVar3 = local_b8;
  t_generator::uppercase(local_b8,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_90,"__",&local_b9);
  this_00 = (t_rs_generator *)local_b0;
  std::__cxx11::string::string((string *)this_00,"_",&local_ba);
  string_replace(this_00,psVar3,&local_90,(string *)local_b0);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  return psVar3;
}

Assistant:

string t_rs_generator::rust_upper_case(const string& name) {
  bool all_uppercase = true;

  for (char i : name) {
    if (isalpha(i) && islower(i)) {
      all_uppercase = false;
      break;
    }
  }

  if (all_uppercase) {
    return name;
  } else {
    string str(uppercase(underscore(name)));
    string_replace(str, "__", "_");
    return str;
  }
}